

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

void parse_escapes(char *src,mtree_entry *mentry)

{
  int iVar1;
  byte *pbVar2;
  long in_RSI;
  byte *in_RDI;
  char c;
  char *dest;
  byte local_19;
  byte *local_18;
  byte *local_8;
  
  local_18 = in_RDI;
  local_8 = in_RDI;
  if ((in_RSI != 0) && (iVar1 = strcmp((char *)in_RDI,"."), iVar1 == 0)) {
    *(undefined1 *)(in_RSI + 0x18) = 1;
  }
  do {
    if (*local_8 == 0) {
      *local_18 = 0;
      return;
    }
    pbVar2 = local_8 + 1;
    local_19 = *local_8;
    if ((local_19 == 0x2f) && (in_RSI != 0)) {
      *(undefined1 *)(in_RSI + 0x18) = 1;
    }
    if (local_19 == 0x5c) {
      switch(*pbVar2) {
      case 0x30:
        if (('/' < (char)local_8[2]) && ((char)local_8[2] < '8')) goto switchD_001586ae_caseD_31;
        local_19 = 0;
        pbVar2 = local_8 + 2;
        break;
      case 0x31:
      case 0x32:
      case 0x33:
switchD_001586ae_caseD_31:
        if (('/' < (char)local_8[2]) &&
           ((((char)local_8[2] < '8' && ('/' < (char)local_8[3])) && ((char)local_8[3] < '8')))) {
          local_19 = *pbVar2 * '@' | (local_8[2] - 0x30) * '\b' | local_8[3] - 0x30;
          pbVar2 = local_8 + 4;
        }
        break;
      case 0x61:
        local_19 = 7;
        pbVar2 = local_8 + 2;
        break;
      case 0x62:
        local_19 = 8;
        pbVar2 = local_8 + 2;
        break;
      case 0x66:
        local_19 = 0xc;
        pbVar2 = local_8 + 2;
        break;
      case 0x6e:
        local_19 = 10;
        pbVar2 = local_8 + 2;
        break;
      case 0x72:
        local_19 = 0xd;
        pbVar2 = local_8 + 2;
        break;
      case 0x73:
        local_19 = 0x20;
        pbVar2 = local_8 + 2;
        break;
      case 0x74:
        local_19 = 9;
        pbVar2 = local_8 + 2;
        break;
      case 0x76:
        local_19 = 0xb;
        pbVar2 = local_8 + 2;
      }
      local_8 = pbVar2;
      pbVar2 = local_8;
    }
    local_8 = pbVar2;
    *local_18 = local_19;
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

static void
parse_escapes(char *src, struct mtree_entry *mentry)
{
	char *dest = src;
	char c;

	if (mentry != NULL && strcmp(src, ".") == 0)
		mentry->full = 1;

	while (*src != '\0') {
		c = *src++;
		if (c == '/' && mentry != NULL)
			mentry->full = 1;
		if (c == '\\') {
			switch (src[0]) {
			case '0':
				if (src[1] < '0' || src[1] > '7') {
					c = 0;
					++src;
					break;
				}
				/* FALLTHROUGH */
			case '1':
			case '2':
			case '3':
				if (src[1] >= '0' && src[1] <= '7' &&
				    src[2] >= '0' && src[2] <= '7') {
					c = (src[0] - '0') << 6;
					c |= (src[1] - '0') << 3;
					c |= (src[2] - '0');
					src += 3;
				}
				break;
			case 'a':
				c = '\a';
				++src;
				break;
			case 'b':
				c = '\b';
				++src;
				break;
			case 'f':
				c = '\f';
				++src;
				break;
			case 'n':
				c = '\n';
				++src;
				break;
			case 'r':
				c = '\r';
				++src;
				break;
			case 's':
				c = ' ';
				++src;
				break;
			case 't':
				c = '\t';
				++src;
				break;
			case 'v':
				c = '\v';
				++src;
				break;
			}
		}
		*dest++ = c;
	}
	*dest = '\0';
}